

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O2

SUNErrCode
SUNAdjointStepper_Create
          (SUNStepper_conflict fwd_sunstepper,int own_fwd,SUNStepper_conflict adj_sunstepper,
          int own_adj,suncountertype final_step_idx,sunrealtype tf,N_Vector sf,
          SUNAdjointCheckpointScheme checkpoint_scheme,SUNContext_conflict sunctx,
          SUNAdjointStepper *adj_stepper_ptr)

{
  SUNAdjointStepper pSVar1;
  
  pSVar1 = (SUNAdjointStepper)malloc(0x50);
  pSVar1->fwd_sunstepper = fwd_sunstepper;
  pSVar1->own_fwd_sunstepper = own_fwd;
  pSVar1->adj_sunstepper = adj_sunstepper;
  pSVar1->own_adj_sunstepper = own_adj;
  pSVar1->checkpoint_scheme = checkpoint_scheme;
  pSVar1->tf = tf;
  pSVar1->final_step_idx = final_step_idx;
  pSVar1->nrecompute = 0;
  pSVar1->user_data = (void *)0x0;
  pSVar1->sunctx = sunctx;
  *adj_stepper_ptr = pSVar1;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointStepper_Create(
  SUNStepper fwd_sunstepper, sunbooleantype own_fwd, SUNStepper adj_sunstepper,
  sunbooleantype own_adj, suncountertype final_step_idx, sunrealtype tf,
  SUNDIALS_MAYBE_UNUSED N_Vector sf, SUNAdjointCheckpointScheme checkpoint_scheme,
  SUNContext sunctx, SUNAdjointStepper* adj_stepper_ptr)
{
  SUNFunctionBegin(sunctx);

  SUNAdjointStepper adj_stepper = NULL;
  adj_stepper = (SUNAdjointStepper)malloc(sizeof(*adj_stepper));
  SUNAssert(adj_stepper, SUN_ERR_MALLOC_FAIL);

  adj_stepper->fwd_sunstepper     = fwd_sunstepper;
  adj_stepper->own_fwd_sunstepper = own_fwd;
  adj_stepper->adj_sunstepper     = adj_sunstepper;
  adj_stepper->own_adj_sunstepper = own_adj;
  adj_stepper->checkpoint_scheme  = checkpoint_scheme;

  adj_stepper->tf             = tf;
  adj_stepper->final_step_idx = final_step_idx;

  adj_stepper->nrecompute = 0;

  adj_stepper->user_data = NULL;
  adj_stepper->sunctx    = sunctx;

  *adj_stepper_ptr = adj_stepper;

  return SUN_SUCCESS;
}